

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_sparse.c
# Opt level: O0

void archive_entry_sparse_add_entry(archive_entry *entry,int64_t offset,int64_t length)

{
  int64_t iVar1;
  ae_sparse *paVar2;
  long in_RDX;
  long in_RSI;
  archive_entry *in_RDI;
  ae_sparse *sp;
  
  if (in_RSI < 0) {
    return;
  }
  if (in_RDX < 0) {
    return;
  }
  if (0x7fffffffffffffff - in_RDX < in_RSI) {
    return;
  }
  iVar1 = archive_entry_size(in_RDI);
  if (in_RSI + in_RDX <= iVar1) {
    paVar2 = in_RDI->sparse_tail;
    if (paVar2 != (ae_sparse *)0x0) {
      if (in_RSI < paVar2->offset + paVar2->length) {
        return;
      }
      if (paVar2->offset + paVar2->length == in_RSI) {
        if (paVar2->offset + paVar2->length + in_RDX < 0) {
          return;
        }
        paVar2->length = in_RDX + paVar2->length;
        return;
      }
    }
    paVar2 = (ae_sparse *)malloc(0x18);
    if (paVar2 != (ae_sparse *)0x0) {
      paVar2->offset = in_RSI;
      paVar2->length = in_RDX;
      paVar2->next = (ae_sparse *)0x0;
      if (in_RDI->sparse_head == (ae_sparse *)0x0) {
        in_RDI->sparse_tail = paVar2;
        in_RDI->sparse_head = paVar2;
      }
      else {
        if (in_RDI->sparse_tail != (ae_sparse *)0x0) {
          in_RDI->sparse_tail->next = paVar2;
        }
        in_RDI->sparse_tail = paVar2;
      }
    }
    return;
  }
  return;
}

Assistant:

void
archive_entry_sparse_add_entry(struct archive_entry *entry,
	int64_t offset, int64_t length)
{
	struct ae_sparse *sp;

	if (offset < 0 || length < 0)
		/* Invalid value */
		return;
	if (offset > INT64_MAX - length ||
	    offset + length > archive_entry_size(entry))
		/* A value of "length" parameter is too large. */
		return;
	if ((sp = entry->sparse_tail) != NULL) {
		if (sp->offset + sp->length > offset)
			/* Invalid value. */
			return;
		if (sp->offset + sp->length == offset) {
			if (sp->offset + sp->length + length < 0)
				/* A value of "length" parameter is
				 * too large. */
				return;
			/* Expand existing sparse block size. */
			sp->length += length;
			return;
		}
	}

	if ((sp = (struct ae_sparse *)malloc(sizeof(*sp))) == NULL)
		/* XXX Error XXX */
		return;

	sp->offset = offset;
	sp->length = length;
	sp->next = NULL;

	if (entry->sparse_head == NULL)
		entry->sparse_head = entry->sparse_tail = sp;
	else {
		/* Add a new sparse block to the tail of list. */
		if (entry->sparse_tail != NULL)
			entry->sparse_tail->next = sp;
		entry->sparse_tail = sp;
	}
}